

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O2

float max_elem(float *arr,int length)

{
  float fVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = *arr;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    fVar1 = arr[lVar2];
    if (arr[lVar2] <= fVar3) {
      fVar1 = fVar3;
    }
    fVar3 = fVar1;
  }
  return fVar3;
}

Assistant:

float max_elem(float* arr, int length)
{
  float max = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] > max)
      max = arr[i];
  return max;
}